

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twtxt.c
# Opt level: O0

void listFollowing(char *followingJSON)

{
  int iVar1;
  cJSON *array;
  char strvalue [400];
  cJSON *followinglist;
  cJSON *following;
  char acStack_1a8 [8];
  cJSON *in_stack_fffffffffffffe60;
  cJSON *local_18;
  
  array = cJSON_Parse((char *)0x10a05c);
  if ((array != (cJSON *)0x0) && (iVar1 = cJSON_GetArraySize(array), iVar1 != 0)) {
    wrkbuf = (char *)malloc(0x1000);
    strncpy(wrkbuf,"",0x1000);
    puts("");
    puts("You are following these users:");
    cJSONUtils_SortObject((cJSON *)0x10a0e0);
    for (local_18 = array->child; local_18 != (cJSON *)0x0; local_18 = local_18->next) {
      sprintf(acStack_1a8,"  @%-20s [ %s ]",local_18->string,local_18->valuestring);
      strncat(wrkbuf,acStack_1a8,8);
    }
    cJSON_Delete(in_stack_fffffffffffffe60);
    cJSON_Delete(in_stack_fffffffffffffe60);
    return;
  }
  puts("You are not following any users yet.\n");
  return;
}

Assistant:

void listFollowing(const char* followingJSON) {
    /* Puts the list of users you follow into <wrkbuf>. */
    cJSON *following = cJSON_Parse(followingJSON);

    if (following == NULL || cJSON_GetArraySize(following) == 0) {
        puts("You are not following any users yet.\n");
        return;
    }

    /* There actually are people you follow. */
    wrkbuf = (char *)malloc(4096); /* 4 KiB should be enough for now */
#ifdef _MSC_VER
    strcpy_s(wrkbuf, 4096, "");
#else
    strncpy(wrkbuf, "", 4096);
#endif

    puts("");
    puts("You are following these users:");

    /* Sort the list first: */
    cJSONUtils_SortObject(following);

    cJSON *followinglist = following->child;
    while (followinglist) {
        /* Traverse through the list. */
        char strvalue[400];

#ifdef _MSC_VER
        sprintf_s(strvalue, sizeof(strvalue), "  @%-20s [ %s ]\n", followinglist->string, followinglist->valuestring);
        strcat_s(wrkbuf, sizeof(strvalue), strvalue);
#else
        sprintf(strvalue, "  @%-20s [ %s ]", followinglist->string, followinglist->valuestring);
        strncat(wrkbuf, strvalue, sizeof(wrkbuf));
#endif
        followinglist = followinglist->next;
    }

    cJSON_Delete(followinglist);
    cJSON_Delete(following);
}